

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O2

char * IoTHubAccount_GetEventhubListenName(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  int iVar1;
  char *pcVar2;
  LOGGER_LOG p_Var3;
  IOTHUB_ACCOUNT_INFO *acctInfo;
  
  pcVar2 = getenv("IOTHUB_EVENTHUB_LISTEN_NAME");
  if ((pcVar2 != (char *)0x0) ||
     ((acctHandle != (IOTHUB_ACCOUNT_INFO_HANDLE)0x0 &&
      (pcVar2 = acctHandle->iothubName, pcVar2 != (char *)0x0)))) {
    iVar1 = sprintf_s(IoTHubAccount_GetEventhubListenName::listenName,0x40,"%s",pcVar2);
    if (iVar1 < 1) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                  ,"IoTHubAccount_GetEventhubListenName",0x3a5,1,
                  "Failed reading IoT Hub Event Hub listen namespace (sprintf_s failed).");
      }
    }
  }
  return IoTHubAccount_GetEventhubListenName::listenName;
}

Assistant:

const char* IoTHubAccount_GetEventhubListenName(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    static char listenName[64];
    const char* value;

#ifndef MBED_BUILD_TIMESTAMP
    if ((value = getenv("IOTHUB_EVENTHUB_LISTEN_NAME")) == NULL)
#else
    if ((value = getMbedParameter("IOTHUB_EVENTHUB_LISTEN_NAME")) == NULL)
#endif
    {
        value = IoTHubAccount_GetIoTHubName(acctHandle);
    }

    if (value != NULL &&
        sprintf_s(listenName, 64, "%s", value) <= 0)
    {
        LogError("Failed reading IoT Hub Event Hub listen namespace (sprintf_s failed).");
    }

    return listenName;
}